

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O2

void addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
               (NeuralNetworkClassifier *nn,OptimizerTypeCase optimizerType,double defaultValue,
               double minValue,double maxValue)

{
  NetworkUpdateParameters *this;
  Optimizer *this_00;
  SGDOptimizer *this_01;
  DoubleParameter *this_02;
  AdamOptimizer *this_03;
  DoubleRange *pDVar1;
  
  this = CoreML::Specification::NeuralNetworkClassifier::mutable_updateparams(nn);
  this_00 = CoreML::Specification::NetworkUpdateParameters::mutable_optimizer(this);
  if (optimizerType == kSgdOptimizer) {
    this_01 = CoreML::Specification::Optimizer::mutable_sgdoptimizer(this_00);
    this_02 = CoreML::Specification::SGDOptimizer::mutable_learningrate(this_01);
  }
  else {
    this_03 = CoreML::Specification::Optimizer::mutable_adamoptimizer(this_00);
    this_02 = CoreML::Specification::AdamOptimizer::mutable_learningrate(this_03);
  }
  this_02->defaultvalue_ = defaultValue;
  pDVar1 = CoreML::Specification::DoubleParameter::mutable_range(this_02);
  pDVar1->minvalue_ = minValue;
  pDVar1->maxvalue_ = maxValue;
  return;
}

Assistant:

void addLearningRate(NeuralNetworkClass *nn, Specification::Optimizer::OptimizerTypeCase optimizerType, double defaultValue, double minValue,  double maxValue) {
    
    auto updateParameters = nn->mutable_updateparams();
    auto optimizer = updateParameters->mutable_optimizer();

    Specification::DoubleParameter *learningRate = NULL;
    
    switch (optimizerType) {
        case Specification::Optimizer::kSgdOptimizer:
            learningRate = optimizer->mutable_sgdoptimizer()->mutable_learningrate();
            break;
        case Specification::Optimizer::kAdamOptimizer:
            learningRate = optimizer->mutable_adamoptimizer()->mutable_learningrate();
            break;
        default:
            break;
    }
    
    learningRate->set_defaultvalue(defaultValue);
    
    auto doubleRange = learningRate->mutable_range();
    doubleRange->set_minvalue(minValue);
    doubleRange->set_maxvalue(maxValue);
}